

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
ProcessorGenerator::generate_dispatch_call(ProcessorGenerator *this,bool template_protocol)

{
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  string function_suffix;
  string protocol;
  string sStack_198;
  string local_178;
  string local_158;
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 local_128 [16];
  string local_118 [32];
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string
            (local_118,"::apache::thrift::protocol::TProtocol",(allocator *)&local_138);
  local_138 = local_128;
  local_130 = 0;
  local_128[0] = 0;
  if ((int)CONCAT71(in_register_00000031,template_protocol) != 0) {
    std::__cxx11::string::assign((char *)local_118);
    std::__cxx11::string::assign((char *)&local_138);
  }
  poVar3 = std::operator<<(this->f_out_,(string *)&this->template_header_);
  poVar3 = std::operator<<(poVar3,(string *)&this->ret_type_);
  poVar3 = std::operator<<(poVar3,(string *)&this->class_name_);
  poVar3 = std::operator<<(poVar3,(string *)&this->template_suffix_);
  poVar3 = std::operator<<(poVar3,"::dispatchCall");
  poVar3 = std::operator<<(poVar3,(string *)&local_138);
  poVar3 = std::operator<<(poVar3,"(");
  poVar3 = std::operator<<(poVar3,(string *)&this->finish_cob_);
  poVar3 = std::operator<<(poVar3,local_118);
  poVar3 = std::operator<<(poVar3,"* iprot, ");
  poVar3 = std::operator<<(poVar3,local_118);
  poVar3 = std::operator<<(poVar3,"* oprot, ");
  poVar3 = std::operator<<(poVar3,"const std::string& fname, int32_t seqid");
  poVar3 = std::operator<<(poVar3,(string *)&this->call_context_);
  poVar3 = std::operator<<(poVar3,") {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = this->f_out_;
  indent_abi_cxx11_(&sStack_198,this);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
  poVar3 = std::operator<<(poVar3,(string *)&this->typename_str_);
  poVar3 = std::operator<<(poVar3,"ProcessMap::iterator pfn;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_158,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_158);
  poVar3 = std::operator<<(poVar3,"pfn = processMap_.find(fname);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_178,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"if (pfn == processMap_.end()) {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&sStack_198);
  poVar3 = this->f_out_;
  if ((this->extends_)._M_string_length == 0) {
    indent_abi_cxx11_(&sStack_198,this);
    poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
    poVar3 = std::operator<<(poVar3,"  iprot->skip(::apache::thrift::protocol::T_STRUCT);");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_158,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_158);
    poVar3 = std::operator<<(poVar3,"  iprot->readMessageEnd();");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_178,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_178);
    poVar3 = std::operator<<(poVar3,"  iprot->getTransport()->readEnd();");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_38,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    poVar3 = std::operator<<(poVar3,
                             "  ::apache::thrift::TApplicationException x(::apache::thrift::TApplicationException::UNKNOWN_METHOD, \"Invalid method name: \'\"+fname+\"\'\");"
                            );
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_58,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_58);
    poVar3 = std::operator<<(poVar3,
                             "  oprot->writeMessageBegin(fname, ::apache::thrift::protocol::T_EXCEPTION, seqid);"
                            );
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_78,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    poVar3 = std::operator<<(poVar3,"  x.write(oprot);");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_98,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_98);
    poVar3 = std::operator<<(poVar3,"  oprot->writeMessageEnd();");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_b8,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_b8);
    poVar3 = std::operator<<(poVar3,"  oprot->getTransport()->writeEnd();");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_d8,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"  oprot->getTransport()->flush();");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_f8,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_f8);
    bVar2 = std::operator==(&this->style_,"Cob");
    pcVar4 = "  return true;";
    if (bVar2) {
      pcVar4 = "  return cob(true);";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
  }
  else {
    indent_abi_cxx11_(&sStack_198,this);
    poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
    poVar3 = std::operator<<(poVar3,"  return ");
    poVar3 = std::operator<<(poVar3,(string *)&this->extends_);
    poVar3 = std::operator<<(poVar3,"::dispatchCall(");
    bVar2 = std::operator==(&this->style_,"Cob");
    pcVar4 = "";
    if (bVar2) {
      pcVar4 = "cob, ";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"iprot, oprot, fname, seqid");
    poVar3 = std::operator<<(poVar3,(string *)&this->call_context_arg_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&sStack_198);
  poVar3 = this->f_out_;
  indent_abi_cxx11_(&sStack_198,this);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_198);
  if (template_protocol) {
    poVar3 = this->f_out_;
    indent_abi_cxx11_(&sStack_198,this);
    poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
    std::operator<<(poVar3,"(this->*(pfn->second.specialized))");
  }
  else if (this->generator_->gen_templates_only_ == true) {
    poVar3 = this->f_out_;
    indent_abi_cxx11_(&sStack_198,this);
    poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
    std::operator<<(poVar3,"(this->*(pfn->second.generic))");
  }
  else {
    poVar3 = this->f_out_;
    if (this->generator_->gen_templates_ == true) {
      indent_abi_cxx11_(&sStack_198,this);
      poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
      std::operator<<(poVar3,"(this->*(pfn->second.generic))");
    }
    else {
      indent_abi_cxx11_(&sStack_198,this);
      poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
      std::operator<<(poVar3,"(this->*(pfn->second))");
    }
  }
  std::__cxx11::string::~string((string *)&sStack_198);
  poVar3 = std::operator<<(this->f_out_,"(");
  poVar3 = std::operator<<(poVar3,(string *)&this->cob_arg_);
  poVar3 = std::operator<<(poVar3,"seqid, iprot, oprot");
  poVar3 = std::operator<<(poVar3,(string *)&this->call_context_arg_);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  bVar2 = std::operator==(&this->style_,"Cob");
  poVar3 = this->f_out_;
  if (bVar2) {
    indent_abi_cxx11_(&sStack_198,this);
    poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
    poVar3 = std::operator<<(poVar3,"return;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    indent_abi_cxx11_(&sStack_198,this);
    poVar3 = std::operator<<(poVar3,(string *)&sStack_198);
    poVar3 = std::operator<<(poVar3,"return true;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&sStack_198);
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = std::operator<<(this->f_out_,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string(local_118);
  return;
}

Assistant:

void ProcessorGenerator::generate_dispatch_call(bool template_protocol) {
  string protocol = "::apache::thrift::protocol::TProtocol";
  string function_suffix;
  if (template_protocol) {
    protocol = "Protocol_";
    // We call the generic version dispatchCall(), and the specialized
    // version dispatchCallTemplated().  We can't call them both
    // dispatchCall(), since this will cause the compiler to issue a warning if
    // a service that doesn't use templates inherits from a service that does
    // use templates: the compiler complains that the subclass only implements
    // the generic version of dispatchCall(), and hides the templated version.
    // Using different names for the two functions prevents this.
    function_suffix = "Templated";
  }

  f_out_ << template_header_ << ret_type_ << class_name_ << template_suffix_ << "::dispatchCall"
         << function_suffix << "(" << finish_cob_ << protocol << "* iprot, " << protocol
         << "* oprot, "
         << "const std::string& fname, int32_t seqid" << call_context_ << ") {" << endl;
  indent_up();

  // HOT: member function pointer map
  f_out_ << indent() << typename_str_ << "ProcessMap::iterator pfn;" << endl << indent()
         << "pfn = processMap_.find(fname);" << endl << indent()
         << "if (pfn == processMap_.end()) {" << endl;
  if (extends_.empty()) {
    f_out_ << indent() << "  iprot->skip(::apache::thrift::protocol::T_STRUCT);" << endl << indent()
           << "  iprot->readMessageEnd();" << endl << indent()
           << "  iprot->getTransport()->readEnd();" << endl << indent()
           << "  ::apache::thrift::TApplicationException "
              "x(::apache::thrift::TApplicationException::UNKNOWN_METHOD, \"Invalid method name: "
              "'\"+fname+\"'\");" << endl << indent()
           << "  oprot->writeMessageBegin(fname, ::apache::thrift::protocol::T_EXCEPTION, seqid);"
           << endl << indent() << "  x.write(oprot);" << endl << indent()
           << "  oprot->writeMessageEnd();" << endl << indent()
           << "  oprot->getTransport()->writeEnd();" << endl << indent()
           << "  oprot->getTransport()->flush();" << endl << indent()
           << (style_ == "Cob" ? "  return cob(true);" : "  return true;") << endl;
  } else {
    f_out_ << indent() << "  return " << extends_ << "::dispatchCall("
           << (style_ == "Cob" ? "cob, " : "") << "iprot, oprot, fname, seqid" << call_context_arg_
           << ");" << endl;
  }
  f_out_ << indent() << "}" << endl;
  if (template_protocol) {
    f_out_ << indent() << "(this->*(pfn->second.specialized))";
  } else {
    if (generator_->gen_templates_only_) {
      // TODO: This is a null pointer, so nothing good will come from calling
      // it.  Throw an exception instead.
      f_out_ << indent() << "(this->*(pfn->second.generic))";
    } else if (generator_->gen_templates_) {
      f_out_ << indent() << "(this->*(pfn->second.generic))";
    } else {
      f_out_ << indent() << "(this->*(pfn->second))";
    }
  }
  f_out_ << "(" << cob_arg_ << "seqid, iprot, oprot" << call_context_arg_ << ");" << endl;

  // TODO(dreiss): return pfn ret?
  if (style_ == "Cob") {
    f_out_ << indent() << "return;" << endl;
  } else {
    f_out_ << indent() << "return true;" << endl;
  }

  indent_down();
  f_out_ << "}" << endl << endl;
}